

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O0

int x25519_derive_secret
              (ptls_iovec_t *secret,uint8_t *clientpriv,uint8_t *clientpub,uint8_t *serverpriv,
              uint8_t *serverpub)

{
  uint8_t *puVar1;
  uint8_t *local_f0;
  int local_cc;
  undefined1 local_c8 [4];
  int ret;
  cf_sha256_context h;
  uint8_t q [32];
  uint8_t *serverpub_local;
  uint8_t *serverpriv_local;
  uint8_t *clientpub_local;
  uint8_t *clientpriv_local;
  ptls_iovec_t *secret_local;
  
  local_f0 = clientpub;
  if (clientpriv != (uint8_t *)0x0) {
    local_f0 = serverpub;
    serverpriv = clientpriv;
  }
  cf_curve25519_mul((uint8_t *)&h.npartial,serverpriv,local_f0);
  puVar1 = (uint8_t *)malloc(0x20);
  secret->base = puVar1;
  if (puVar1 == (uint8_t *)0x0) {
    local_cc = 0x201;
  }
  else {
    secret->len = 0x20;
    cf_sha256_init((cf_sha256_context *)local_c8);
    cf_sha256_update((cf_sha256_context *)local_c8,&h.npartial,0x20);
    cf_sha256_update((cf_sha256_context *)local_c8,clientpub,0x20);
    cf_sha256_update((cf_sha256_context *)local_c8,serverpub,0x20);
    cf_sha256_digest_final((cf_sha256_context *)local_c8,secret->base);
    local_cc = 0;
  }
  (*ptls_clear_memory)(&h.npartial,0x20);
  return local_cc;
}

Assistant:

static int x25519_derive_secret(ptls_iovec_t *secret, const uint8_t *clientpriv, const uint8_t *clientpub,
                                const uint8_t *serverpriv, const uint8_t *serverpub)
{
    uint8_t q[X25519_KEY_SIZE];
    cf_sha256_context h;
    int ret;

    cf_curve25519_mul(q, clientpriv != NULL ? clientpriv : serverpriv, clientpriv != NULL ? serverpub : clientpub);

    if ((secret->base = malloc(CF_SHA256_HASHSZ)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    secret->len = CF_SHA256_HASHSZ;

    cf_sha256_init(&h);
    cf_sha256_update(&h, q, X25519_KEY_SIZE);
    cf_sha256_update(&h, clientpub, X25519_KEY_SIZE);
    cf_sha256_update(&h, serverpub, X25519_KEY_SIZE);
    cf_sha256_digest_final(&h, secret->base);

    ret = 0;
Exit:
    ptls_clear_memory(q, sizeof(q));
    return ret;
}